

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_cvars.cpp
# Opt level: O0

bool FBaseCVar::ToBool(UCVarValue value,ECVarType type)

{
  int iVar1;
  long lVar2;
  float fStack_18;
  ECVarType type_local;
  UCVarValue value_local;
  
  fStack_18 = value.Float;
  switch(type) {
  case CVAR_Bool:
    fStack_18._0_1_ = value.Bool;
    value_local._7_1_ = fStack_18._0_1_ & 1;
    break;
  case CVAR_Int:
    value_local._7_1_ = fStack_18 != 0.0;
    break;
  case CVAR_Float:
    value_local._7_1_ = fStack_18 != 0.0;
    break;
  case CVAR_String:
    iVar1 = strcasecmp(value.String,"true");
    if (iVar1 == 0) {
      value_local._7_1_ = 1;
    }
    else {
      iVar1 = strcasecmp(value.String,"false");
      if (iVar1 == 0) {
        value_local._7_1_ = 0;
      }
      else {
        lVar2 = strtol(value.String,(char **)0x0,0);
        value_local._7_1_ = lVar2 != 0;
      }
    }
    break;
  default:
    value_local._7_1_ = 0;
    break;
  case CVAR_GUID:
    value_local._7_1_ = 0;
  }
  return value_local._7_1_;
}

Assistant:

bool FBaseCVar::ToBool (UCVarValue value, ECVarType type)
{
	switch (type)
	{
	case CVAR_Bool:
		return value.Bool;

	case CVAR_Int:
		return !!value.Int;

	case CVAR_Float:
		return value.Float != 0.f;

	case CVAR_String:
		if (stricmp (value.String, "true") == 0)
			return true;
		else if (stricmp (value.String, "false") == 0)
			return false;
		else
			return !!strtol (value.String, NULL, 0);

	case CVAR_GUID:
		return false;

	default:
		return false;
	}
}